

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiled.cpp
# Opt level: O1

void __thiscall
Rml::DecoratorTiledInstancer::RegisterTileProperty
          (DecoratorTiledInstancer *this,String *name,bool register_fit_modes)

{
  EffectSpecification *this_00;
  pointer *ppTVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  iterator __position;
  PropertyId PVar4;
  PropertyDefinition *pPVar5;
  long *plVar6;
  size_type *psVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  TilePropertyIds ids;
  String align_y_name;
  String local_130;
  String align_x_name;
  String fit_name;
  String local_d0;
  String local_b0;
  String local_90;
  String local_70;
  String additional_modes;
  
  ids.orientation = Invalid;
  ids.src = Invalid;
  ids.fit = Invalid;
  ids.align_x = Invalid;
  ids.align_y = Invalid;
  CreateString_abi_cxx11_(&additional_modes,"%s-src",(name->_M_dataplus)._M_p);
  fit_name._M_dataplus._M_p = (pointer)&fit_name.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&fit_name,"");
  this_00 = &(this->super_DecoratorInstancer).super_EffectSpecification;
  pPVar5 = EffectSpecification::RegisterProperty(this_00,&additional_modes,&fit_name);
  align_x_name._M_dataplus._M_p = (pointer)&align_x_name.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&align_x_name,"string","");
  align_y_name._M_dataplus._M_p = (pointer)&align_y_name.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&align_y_name,"");
  pPVar5 = PropertyDefinition::AddParser(pPVar5,&align_x_name,&align_y_name);
  PVar4 = PropertyDefinition::GetId(pPVar5);
  ids.src = PVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)align_y_name._M_dataplus._M_p != &align_y_name.field_2) {
    operator_delete(align_y_name._M_dataplus._M_p,align_y_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)align_x_name._M_dataplus._M_p != &align_x_name.field_2) {
    operator_delete(align_x_name._M_dataplus._M_p,align_x_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fit_name._M_dataplus._M_p != &fit_name.field_2) {
    operator_delete(fit_name._M_dataplus._M_p,fit_name.field_2._M_allocated_capacity + 1);
  }
  paVar8 = &additional_modes.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)additional_modes._M_dataplus._M_p != paVar8) {
    operator_delete(additional_modes._M_dataplus._M_p,
                    CONCAT71(additional_modes.field_2._M_allocated_capacity._1_7_,
                             additional_modes.field_2._M_local_buf[0]) + 1);
  }
  additional_modes._M_string_length = 0;
  additional_modes.field_2._M_local_buf[0] = '\0';
  additional_modes._M_dataplus._M_p = (pointer)paVar8;
  if (register_fit_modes) {
    CreateString_abi_cxx11_(&fit_name,"%s-fit",(name->_M_dataplus)._M_p);
    align_x_name._M_dataplus._M_p = (pointer)&align_x_name.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&align_x_name,"fill","");
    pPVar5 = EffectSpecification::RegisterProperty(this_00,&fit_name,&align_x_name);
    align_y_name._M_dataplus._M_p = (pointer)&align_y_name.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&align_y_name,"keyword","");
    paVar8 = &local_130.field_2;
    local_130._M_dataplus._M_p = (pointer)paVar8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,
               "fill, contain, cover, scale-none, scale-down, repeat, repeat-x, repeat-y","");
    pPVar5 = PropertyDefinition::AddParser(pPVar5,&align_y_name,&local_130);
    PVar4 = PropertyDefinition::GetId(pPVar5);
    ids.fit = PVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar8) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)align_y_name._M_dataplus._M_p != &align_y_name.field_2) {
      operator_delete(align_y_name._M_dataplus._M_p,align_y_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)align_x_name._M_dataplus._M_p != &align_x_name.field_2) {
      operator_delete(align_x_name._M_dataplus._M_p,align_x_name.field_2._M_allocated_capacity + 1);
    }
    CreateString_abi_cxx11_(&align_x_name,"%s-align-x",(name->_M_dataplus)._M_p);
    align_y_name._M_dataplus._M_p = (pointer)&align_y_name.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&align_y_name,"center","");
    pPVar5 = EffectSpecification::RegisterProperty(this_00,&align_x_name,&align_y_name);
    local_130._M_dataplus._M_p = (pointer)paVar8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"keyword","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"left, center, right","");
    pPVar5 = PropertyDefinition::AddParser(pPVar5,&local_130,&local_d0);
    paVar8 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"length_percent","");
    paVar2 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
    pPVar5 = PropertyDefinition::AddParser(pPVar5,&local_90,&local_b0);
    PVar4 = PropertyDefinition::GetId(pPVar5);
    ids.align_x = PVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar8) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)align_y_name._M_dataplus._M_p != &align_y_name.field_2) {
      operator_delete(align_y_name._M_dataplus._M_p,align_y_name.field_2._M_allocated_capacity + 1);
    }
    CreateString_abi_cxx11_(&align_y_name,"%s-align-y",(name->_M_dataplus)._M_p);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"center","");
    pPVar5 = EffectSpecification::RegisterProperty(this_00,&align_y_name,&local_130);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"keyword","");
    local_90._M_dataplus._M_p = (pointer)paVar8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"top, center, bottom","");
    pPVar5 = PropertyDefinition::AddParser(pPVar5,&local_d0,&local_90);
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"length_percent","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    pPVar5 = PropertyDefinition::AddParser(pPVar5,&local_b0,&local_70);
    PVar4 = PropertyDefinition::GetId(pPVar5);
    ids.align_y = PVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar8) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    ::std::operator+(&local_70,", ",&fit_name);
    plVar6 = (long *)::std::__cxx11::string::append((char *)&local_70);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_b0.field_2._M_allocated_capacity = *psVar7;
      local_b0.field_2._8_8_ = plVar6[3];
      local_b0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar7;
      local_b0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_b0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_b0,(ulong)align_x_name._M_dataplus._M_p);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_90.field_2._M_allocated_capacity = *psVar7;
      local_90.field_2._8_8_ = plVar6[3];
      local_90._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar7;
      local_90._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_90._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)::std::__cxx11::string::append((char *)&local_90);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_d0.field_2._M_allocated_capacity = *psVar7;
      local_d0.field_2._8_8_ = plVar6[3];
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar7;
      local_d0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_d0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)align_y_name._M_dataplus._M_p);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_130.field_2._M_allocated_capacity = *psVar7;
      local_130.field_2._8_8_ = plVar6[3];
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar7;
      local_130._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_130._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&additional_modes,(ulong)local_130._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar8) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)align_y_name._M_dataplus._M_p != &align_y_name.field_2) {
      operator_delete(align_y_name._M_dataplus._M_p,align_y_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)align_x_name._M_dataplus._M_p != &align_x_name.field_2) {
      operator_delete(align_x_name._M_dataplus._M_p,align_x_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fit_name._M_dataplus._M_p != &fit_name.field_2) {
      operator_delete(fit_name._M_dataplus._M_p,fit_name.field_2._M_allocated_capacity + 1);
    }
  }
  paVar8 = &align_x_name.field_2;
  CreateString_abi_cxx11_(&fit_name,"%s-orientation",(name->_M_dataplus)._M_p);
  align_x_name._M_dataplus._M_p = (pointer)paVar8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&align_x_name,"none","");
  pPVar5 = EffectSpecification::RegisterProperty(this_00,&fit_name,&align_x_name);
  align_y_name._M_dataplus._M_p = (pointer)&align_y_name.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&align_y_name,"keyword","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,"none, flip-horizontal, flip-vertical, rotate-180","");
  pPVar5 = PropertyDefinition::AddParser(pPVar5,&align_y_name,&local_130);
  ids.orientation = PropertyDefinition::GetId(pPVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)align_y_name._M_dataplus._M_p != &align_y_name.field_2) {
    operator_delete(align_y_name._M_dataplus._M_p,align_y_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)align_x_name._M_dataplus._M_p != paVar8) {
    operator_delete(align_x_name._M_dataplus._M_p,align_x_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fit_name._M_dataplus._M_p != &fit_name.field_2) {
    operator_delete(fit_name._M_dataplus._M_p,fit_name.field_2._M_allocated_capacity + 1);
  }
  ::std::operator+(&align_x_name,"%s-src, %s-orientation",&additional_modes);
  pcVar3 = (name->_M_dataplus)._M_p;
  CreateString_abi_cxx11_
            (&fit_name,align_x_name._M_dataplus._M_p,pcVar3,pcVar3,pcVar3,pcVar3,pcVar3,pcVar3);
  EffectSpecification::RegisterShorthand(this_00,name,&fit_name,FallThrough);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fit_name._M_dataplus._M_p != &fit_name.field_2) {
    operator_delete(fit_name._M_dataplus._M_p,fit_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)align_x_name._M_dataplus._M_p != paVar8) {
    operator_delete(align_x_name._M_dataplus._M_p,align_x_name.field_2._M_allocated_capacity + 1);
  }
  __position._M_current =
       (this->tile_property_ids).
       super__Vector_base<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->tile_property_ids).
      super__Vector_base<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    ::std::
    vector<Rml::DecoratorTiledInstancer::TilePropertyIds,std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>>
    ::_M_realloc_insert<Rml::DecoratorTiledInstancer::TilePropertyIds_const&>
              ((vector<Rml::DecoratorTiledInstancer::TilePropertyIds,std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>>
                *)&this->tile_property_ids,__position,&ids);
  }
  else {
    (__position._M_current)->orientation = ids.orientation;
    (__position._M_current)->src = ids.src;
    (__position._M_current)->fit = ids.fit;
    (__position._M_current)->align_x = ids.align_x;
    (__position._M_current)->align_y = ids.align_y;
    ppTVar1 = &(this->tile_property_ids).
               super__Vector_base<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)additional_modes._M_dataplus._M_p != &additional_modes.field_2) {
    operator_delete(additional_modes._M_dataplus._M_p,
                    CONCAT71(additional_modes.field_2._M_allocated_capacity._1_7_,
                             additional_modes.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void DecoratorTiledInstancer::RegisterTileProperty(const String& name, bool register_fit_modes)
{
	TilePropertyIds ids = {};

	ids.src = RegisterProperty(CreateString("%s-src", name.c_str()), "").AddParser("string").GetId();

	String additional_modes;

	if (register_fit_modes)
	{
		String fit_name = CreateString("%s-fit", name.c_str());
		ids.fit = RegisterProperty(fit_name, "fill")
					  .AddParser("keyword", "fill, contain, cover, scale-none, scale-down, repeat, repeat-x, repeat-y")
					  .GetId();

		String align_x_name = CreateString("%s-align-x", name.c_str());
		ids.align_x = RegisterProperty(align_x_name, "center").AddParser("keyword", "left, center, right").AddParser("length_percent").GetId();

		String align_y_name = CreateString("%s-align-y", name.c_str());
		ids.align_y = RegisterProperty(align_y_name, "center").AddParser("keyword", "top, center, bottom").AddParser("length_percent").GetId();

		additional_modes += ", " + fit_name + ", " + align_x_name + ", " + align_y_name;
	}

	ids.orientation = RegisterProperty(CreateString("%s-orientation", name.c_str()), "none")
						  .AddParser("keyword", "none, flip-horizontal, flip-vertical, rotate-180")
						  .GetId();

	RegisterShorthand(name,
		CreateString(("%s-src, %s-orientation" + additional_modes).c_str(), name.c_str(), name.c_str(), name.c_str(), name.c_str(), name.c_str(),
			name.c_str()),
		ShorthandType::FallThrough);

	tile_property_ids.push_back(ids);
}